

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

TempFile * perfetto::base::TempFile::Create(void)

{
  string *this;
  uint __errnum;
  pointer pcVar1;
  code *pcVar2;
  int r;
  long *plVar3;
  uint *puVar4;
  char *pcVar5;
  size_type *psVar6;
  TempFile *in_RDI;
  long *local_68 [2];
  long local_58 [2];
  size_type *local_48;
  _Alloc_hider local_40;
  size_type local_38 [2];
  
  TempFile(in_RDI);
  GetSysTempDir_abi_cxx11_();
  plVar3 = (long *)::std::__cxx11::string::append((char *)local_68);
  psVar6 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar6) {
    local_38[0] = *psVar6;
    local_38[1] = plVar3[3];
    local_48 = local_38;
  }
  else {
    local_38[0] = *psVar6;
    local_48 = (size_type *)*plVar3;
  }
  local_40._M_p = (pointer)plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  this = &in_RDI->path_;
  ::std::__cxx11::string::operator=((string *)this,(string *)&local_48);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  r = mkstemp((this->_M_dataplus)._M_p);
  ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
  ::reset(&in_RDI->fd_,r);
  if ((in_RDI->fd_).t_ != -1) {
    return in_RDI;
  }
  Create((TempFile *)&local_48);
  psVar6 = local_48;
  pcVar1 = (this->_M_dataplus)._M_p;
  puVar4 = (uint *)__errno_location();
  __errnum = *puVar4;
  pcVar5 = strerror(__errnum);
  LogMessage(kLogError,(char *)psVar6,0x18d5,"Could not create temp file %s (errno: %d, %s)",pcVar1,
             (ulong)__errnum,pcVar5);
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

TempFile TempFile::Create() {
  TempFile temp_file;
#if PERFETTO_BUILDFLAG(PERFETTO_OS_WIN)
  temp_file.path_ = GetSysTempDir() + "\\" + GetTempName();
  // Several tests want to read-back the temp file while still open. On Windows,
  // that requires FILE_SHARE_READ. FILE_SHARE_READ is NOT settable when using
  // the POSIX-compat equivalent function _open(). Hence the CreateFileA +
  // _open_osfhandle dance here.
  HANDLE h =
      ::CreateFileA(temp_file.path_.c_str(), GENERIC_READ | GENERIC_WRITE,
                    FILE_SHARE_DELETE | FILE_SHARE_READ, nullptr, CREATE_ALWAYS,
                    FILE_ATTRIBUTE_TEMPORARY, nullptr);
  PERFETTO_CHECK(PlatformHandleChecker::IsValid(h));
  // According to MSDN, when using _open_osfhandle the caller must not call
  // CloseHandle(). Ownership is moved to the file descriptor, which then needs
  // to be closed with just with _close().
  temp_file.fd_.reset(_open_osfhandle(reinterpret_cast<intptr_t>(h), 0));
#else
  temp_file.path_ = GetSysTempDir() + "/perfetto-XXXXXXXX";
  temp_file.fd_.reset(mkstemp(&temp_file.path_[0]));
#endif
  if (PERFETTO_UNLIKELY(!temp_file.fd_)) {
    PERFETTO_FATAL("Could not create temp file %s", temp_file.path_.c_str());
  }
  return temp_file;
}